

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dual_Resampler.cpp
# Opt level: O3

void __thiscall
Dual_Resampler::dual_play(Dual_Resampler *this,long count,dsample_t *out,Blip_Buffer *blip_buf)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = this->sample_buf_size;
  iVar1 = this->buf_pos;
  if (iVar2 != iVar1) {
    lVar3 = (long)(iVar2 - iVar1);
    if (count <= iVar2 - iVar1) {
      lVar3 = count;
    }
    count = count - lVar3;
    memcpy(out,(this->sample_buf).begin_ + iVar1,lVar3 * 2);
    out = out + lVar3;
    this->buf_pos = this->buf_pos + (int)lVar3;
    iVar2 = this->sample_buf_size;
  }
  lVar3 = (long)iVar2;
  for (; lVar3 <= count; count = count - lVar3) {
    play_frame_(this,blip_buf,out);
    lVar3 = (long)this->sample_buf_size;
    out = out + lVar3;
  }
  if (count != 0) {
    play_frame_(this,blip_buf,(this->sample_buf).begin_);
    this->buf_pos = (int)count;
    memcpy(out,(this->sample_buf).begin_,count * 2);
    return;
  }
  return;
}

Assistant:

void Dual_Resampler::dual_play( long count, dsample_t* out, Blip_Buffer& blip_buf )
{
	// empty extra buffer
	long remain = sample_buf_size - buf_pos;
	if ( remain )
	{
		if ( remain > count )
			remain = count;
		count -= remain;
		memcpy( out, &sample_buf [buf_pos], remain * sizeof *out );
		out += remain;
		buf_pos += remain;
	}
	
	// entire frames
	while ( count >= (long) sample_buf_size )
	{
		play_frame_( blip_buf, out );
		out += sample_buf_size;
		count -= sample_buf_size;
	}
	
	// extra
	if ( count )
	{
		play_frame_( blip_buf, sample_buf.begin() );
		buf_pos = count;
		memcpy( out, sample_buf.begin(), count * sizeof *out );
		out += count;
	}
}